

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.h
# Opt level: O0

tm * __thiscall fmt::v5::localtime(v5 *this,time_t *__timer)

{
  bool bVar1;
  format_error *this_00;
  undefined1 local_50 [8];
  dispatcher lt;
  time_t time_local;
  
  lt.tm_.tm_zone = (char *)__timer;
  localtime::dispatcher::dispatcher((dispatcher *)local_50,(time_t)__timer);
  bVar1 = localtime::dispatcher::run((dispatcher *)local_50);
  if (!bVar1) {
    this_00 = (format_error *)__cxa_allocate_exception(0x10);
    format_error::format_error(this_00,"time_t value out of range");
    __cxa_throw(this_00,&format_error::typeinfo,format_error::~format_error);
  }
  memcpy(this,&lt,0x38);
  return (tm *)this;
}

Assistant:

inline std::tm localtime(std::time_t time) {
  struct dispatcher {
    std::time_t time_;
    std::tm tm_;

    dispatcher(std::time_t t): time_(t) {}

    bool run() {
      using namespace fmt::internal;
      return handle(localtime_r(&time_, &tm_));
    }

    bool handle(std::tm *tm) { return tm != FMT_NULL; }

    bool handle(internal::null<>) {
      using namespace fmt::internal;
      return fallback(localtime_s(&tm_, &time_));
    }

    bool fallback(int res) { return res == 0; }

    bool fallback(internal::null<>) {
      using namespace fmt::internal;
      std::tm *tm = std::localtime(&time_);
      if (tm) tm_ = *tm;
      return tm != FMT_NULL;
    }
  };
  dispatcher lt(time);
  if (lt.run())
    return lt.tm_;
  // Too big time values may be unsupported.
  FMT_THROW(format_error("time_t value out of range"));
}